

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O3

void connection_on_io_open_complete(void *context,IO_OPEN_RESULT io_open_result)

{
  uint uVar1;
  int iVar2;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  CONNECTION_STATE connection_state;
  
  if (io_open_result == IO_OPEN_OK) {
    uVar1 = *(uint *)((long)context + 0x10);
    if (9 < uVar1) {
LAB_00164729:
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                   ,"connection_on_io_open_complete",0x2e3,1,"Unknown connection state: %d",
                   *(undefined4 *)((long)context + 0x10));
      }
      return;
    }
    if ((0x2c4U >> (uVar1 & 0x1f) & 1) != 0) {
      return;
    }
    if (uVar1 == 0) {
      iVar2 = xio_send(*context,"AMQP",8,unchecked_on_send_complete,(void *)0x0);
      if (iVar2 != 0) {
        iVar2 = xio_close(*context,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
        if ((iVar2 != 0) &&
           (UNRECOVERED_JUMPTABLE = xlogging_get_log_function(),
           UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0)) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                     ,"send_header",0x8a,1,"xio_close failed");
        }
        connection_set_state((CONNECTION_HANDLE)context,CONNECTION_STATE_END);
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
          return;
        }
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                   ,"connection_on_io_open_complete",0x2eb,1,"Cannot send header");
        return;
      }
      if (((*(byte *)((long)context + 0xe0) & 8) != 0) &&
         (UNRECOVERED_JUMPTABLE = xlogging_get_log_function(),
         UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0)) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_TRACE,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                   ,"send_header",0x97,1,"-> Header (AMQP 0.1.0.0)");
      }
      connection_state = CONNECTION_STATE_HDR_SENT;
      goto LAB_0016471f;
    }
    if (uVar1 != 3) goto LAB_00164729;
    iVar2 = send_open_frame((CONNECTION_HANDLE)context);
    if (iVar2 == 0) {
      return;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                 ,"connection_on_io_open_complete",0x2fa,1,"Cannot send OPEN frame");
    }
  }
  connection_state = CONNECTION_STATE_END;
LAB_0016471f:
  connection_set_state((CONNECTION_HANDLE)context,connection_state);
  return;
}

Assistant:

static void connection_on_io_open_complete(void* context, IO_OPEN_RESULT io_open_result)
{
    CONNECTION_HANDLE connection = (CONNECTION_HANDLE)context;

    if (io_open_result == IO_OPEN_OK)
    {
        /* Codes_S_R_S_CONNECTION_01_084: [The connection_instance state machine implementing the protocol requirements shall be run as part of connection_dowork.] */
        switch (connection->connection_state)
        {
        default:
            LogError("Unknown connection state: %d", (int)connection->connection_state);
            break;

        case CONNECTION_STATE_START:
            /* Codes_S_R_S_CONNECTION_01_086: [Prior to sending any frames on a connection_instance, each peer MUST start by sending a protocol header that indicates the protocol version used on the connection_instance.] */
            /* Codes_S_R_S_CONNECTION_01_091: [The AMQP peer which acted in the role of the TCP client (i.e. the peer that actively opened the connection_instance) MUST immediately send its outgoing protocol header on establishment of the TCP connection_instance.] */
            if (send_header(connection) != 0)
            {
                LogError("Cannot send header");
            }
            break;

        case CONNECTION_STATE_HDR_SENT:
        case CONNECTION_STATE_OPEN_SENT:
        case CONNECTION_STATE_OPENED:
            break;

        case CONNECTION_STATE_HDR_EXCH:
            /* Codes_S_R_S_CONNECTION_01_002: [Each AMQP connection_instance begins with an exchange of capabilities and limitations, including the maximum frame size.] */
            /* Codes_S_R_S_CONNECTION_01_004: [After establishing or accepting a TCP connection_instance and sending the protocol header, each peer MUST send an open frame before sending any other frames.] */
            /* Codes_S_R_S_CONNECTION_01_005: [The open frame describes the capabilities and limits of that peer.] */
            if (send_open_frame(connection) != 0)
            {
                LogError("Cannot send OPEN frame");
                connection_set_state(connection, CONNECTION_STATE_END);
            }
            break;

        case CONNECTION_STATE_OPEN_RCVD:
            break;
        }
    }
    else
    {
        connection_set_state(connection, CONNECTION_STATE_END);
    }
}